

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineHuge.cpp
# Opt level: O2

void anon_unknown.dwarf_ee296::readWriteTest
               (int channelCount,int testTimes,bool random_channel_data,string *fn)

{
  ostream *poVar1;
  uint l;
  int j;
  int k;
  int j_1;
  Array<Imf_3_2::Array2D<void_*>_> data;
  DeepScanLineOutputFile file;
  Array<Imf_3_2::Array2D<void_*>_> data_1;
  int type;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing files with ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
  poVar1 = std::operator<<(poVar1," channels ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,5);
  poVar1 = std::operator<<(poVar1," times.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  (*(code *)&UNK_00147f86)();
  return;
}

Assistant:

void
readWriteTest (
    int                channelCount,
    int                testTimes,
    bool               random_channel_data,
    const std::string& fn)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes
         << " times." << endl
         << flush;
    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (channelCount, compression, random_channel_data, fn);
        readFile (channelCount, false, fn);
        remove (fn.c_str ());
    }
}